

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_multi_simple_var
              (secp256k1_gej *r,secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,
              void *cbdata,size_t n_points)

{
  int iVar1;
  size_t sVar2;
  secp256k1_ge point;
  secp256k1_gej pointj;
  secp256k1_scalar scalar;
  secp256k1_gej tmpj;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_strauss_state local_9d8;
  secp256k1_ge local_9c0;
  secp256k1_gej local_968;
  secp256k1_scalar local_8e8;
  secp256k1_gej local_8c8;
  secp256k1_fe local_848 [8];
  secp256k1_ge local_708 [8];
  secp256k1_strauss_point_state local_448;
  
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  local_8c8.infinity = 1;
  local_8c8.x.n[0] = 0;
  local_8c8.x.n[1] = 0;
  local_8c8.x.n[2] = 0;
  local_8c8.x.n[3] = 0;
  local_8c8.x.n[4] = 0;
  local_8c8.y.n[0] = 0;
  local_8c8.y.n[1] = 0;
  local_8c8.y.n[2] = 0;
  local_8c8.y.n[3] = 0;
  local_8c8.y.n[4] = 0;
  local_8c8.z.n[0] = 0;
  local_8c8.z.n[1] = 0;
  local_8c8.z.n[2] = 0;
  local_8c8.z.n[3] = 0;
  local_8c8.z.n[4] = 0;
  local_968.x.n[0] = (uint64_t)local_848;
  local_968.x.n[1] = (uint64_t)local_708;
  local_968.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_968,r,1,&local_8c8,&secp256k1_scalar_zero,inp_g_sc);
  if (n_points != 0) {
    sVar2 = 0;
    do {
      iVar1 = (*cb)(&local_8e8,&local_9c0,sVar2,cbdata);
      if (iVar1 == 0) {
        return 0;
      }
      local_968.infinity = local_9c0.infinity;
      local_968.x.n[4] = local_9c0.x.n[4];
      local_968.x.n[2] = local_9c0.x.n[2];
      local_968.x.n[3] = local_9c0.x.n[3];
      local_968.x.n[0] = local_9c0.x.n[0];
      local_968.x.n[1] = local_9c0.x.n[1];
      local_968.y.n[4] = local_9c0.y.n[4];
      local_968.y.n[2] = local_9c0.y.n[2];
      local_968.y.n[3] = local_9c0.y.n[3];
      local_968.y.n[0] = local_9c0.y.n[0];
      local_968.y.n[1] = local_9c0.y.n[1];
      local_968.z.n[0] = 1;
      local_968.z.n[3] = 0;
      local_968.z.n[4] = 0;
      local_968.z.n[1] = 0;
      local_968.z.n[2] = 0;
      local_9d8.aux = local_848;
      local_9d8.pre_a = local_708;
      local_9d8.ps = &local_448;
      secp256k1_ecmult_strauss_wnaf
                (&local_9d8,&local_8c8,1,&local_968,&local_8e8,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r,r,&local_8c8,(secp256k1_fe *)0x0);
      sVar2 = sVar2 + 1;
    } while (n_points != sVar2);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_simple_var(secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points) {
    size_t point_idx;
    secp256k1_gej tmpj;

    secp256k1_gej_set_infinity(r);
    secp256k1_gej_set_infinity(&tmpj);
    /* r = inp_g_sc*G */
    secp256k1_ecmult(r, &tmpj, &secp256k1_scalar_zero, inp_g_sc);
    for (point_idx = 0; point_idx < n_points; point_idx++) {
        secp256k1_ge point;
        secp256k1_gej pointj;
        secp256k1_scalar scalar;
        if (!cb(&scalar, &point, point_idx, cbdata)) {
            return 0;
        }
        /* r += scalar*point */
        secp256k1_gej_set_ge(&pointj, &point);
        secp256k1_ecmult(&tmpj, &pointj, &scalar, NULL);
        secp256k1_gej_add_var(r, r, &tmpj, NULL);
    }
    return 1;
}